

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void http_rd_cb(void *arg)

{
  size_t local_48;
  size_t n;
  nni_iov *iov;
  uint niov;
  nng_err rv;
  size_t cnt;
  nni_aio *uaio;
  nni_aio *aio;
  nni_http_conn *conn;
  void *arg_local;
  
  uaio = (nni_aio *)((long)arg + 0x50);
  aio = (nni_aio *)arg;
  conn = (nni_http_conn *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x3e0));
  iov._4_4_ = nni_aio_result(uaio);
  if (iov._4_4_ == NNG_OK) {
    _niov = nni_aio_count(uaio);
    if (((ulong)aio[4].a_reap_node.rn_next & 1) == 0) {
      if (aio[4].a_inputs[2] != aio[4].a_inputs[3]) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_conn.c"
                  ,399,"conn->rd_get == conn->rd_put");
      }
      cnt = (size_t)(aio->a_task).task_tq;
      if ((nni_aio *)cnt == (nni_aio *)0x0) {
        nni_mtx_unlock(&aio[2].a_task.task_mtx);
      }
      else {
        nni_aio_get_iov((nni_aio *)cnt,(uint *)&iov,(nni_iov **)&n);
        while ((uint)iov != 0 && _niov != 0) {
          local_48 = *(ulong *)(n + 8);
          if (_niov < local_48) {
            local_48 = _niov;
          }
          *(size_t *)(n + 8) = *(long *)(n + 8) - local_48;
          *(size_t *)n = *(long *)n + local_48;
          nni_aio_bump_count((nni_aio *)cnt,local_48);
          _niov = _niov - local_48;
          if (*(long *)(n + 8) == 0) {
            iov._0_4_ = (uint)iov - 1;
            n = n + 0x10;
          }
        }
        nni_aio_set_iov((nni_aio *)cnt,(uint)iov,(nni_iov *)n);
        http_rd_start((nni_http_conn *)aio);
        nni_mtx_unlock(&aio[2].a_task.task_mtx);
      }
    }
    else {
      aio[4].a_inputs[3] = (void *)(_niov + (long)aio[4].a_inputs[3]);
      if (aio[4].a_inputs[1] < aio[4].a_inputs[3]) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_conn.c"
                  ,0x187,"conn->rd_put <= conn->bufsz");
      }
      http_rd_start((nni_http_conn *)aio);
      nni_mtx_unlock(&aio[2].a_task.task_mtx);
    }
  }
  else {
    cnt = (size_t)(aio->a_task).task_tq;
    if ((nni_aio *)cnt != (nni_aio *)0x0) {
      (aio->a_task).task_tq = (nni_taskq *)0x0;
      nni_aio_finish_error((nni_aio *)cnt,iov._4_4_);
    }
    http_close((nni_http_conn *)aio);
    nni_mtx_unlock(&aio[2].a_task.task_mtx);
  }
  return;
}

Assistant:

static void
http_rd_cb(void *arg)
{
	nni_http_conn *conn = arg;
	nni_aio       *aio  = &conn->rd_aio;
	nni_aio       *uaio;
	size_t         cnt;
	nng_err        rv;
	unsigned       niov;
	nni_iov       *iov;

	nni_mtx_lock(&conn->mtx);

	if ((rv = nni_aio_result(aio)) != 0) {
		if ((uaio = conn->rd_uaio) != NULL) {
			conn->rd_uaio = NULL;
			nni_aio_finish_error(uaio, rv);
		}
		http_close(conn);
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	cnt = nni_aio_count(aio);

	// If we were reading into the buffer, then advance location(s).
	if (conn->buffered) {
		conn->rd_put += cnt;
		NNI_ASSERT(conn->rd_put <= conn->bufsz);
		http_rd_start(conn);
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	// Otherwise we are completing a USER request, and there should
	// be no data left in the user buffer.
	NNI_ASSERT(conn->rd_get == conn->rd_put);

	if ((uaio = conn->rd_uaio) == NULL) {
		// This indicates that a read request was canceled.  This
		// can occur only when shutting down, really.
		nni_mtx_unlock(&conn->mtx);
		return;
	}

	nni_aio_get_iov(uaio, &niov, &iov);

	while ((niov != 0) && (cnt != 0)) {
		// Pull up data from the buffer if possible.
		size_t n = iov[0].iov_len;
		if (n > cnt) {
			n = cnt;
		}
		iov[0].iov_len -= n;
		NNI_INCPTR(iov[0].iov_buf, n);
		nni_aio_bump_count(uaio, n);
		cnt -= n;

		if (iov[0].iov_len == 0) {
			niov--;
			iov = &iov[1];
		}
	}
	nni_aio_set_iov(uaio, niov, iov);

	// Resubmit the start.  This will attempt to consume data
	// from the read buffer (there won't be any), and then either
	// complete the I/O (for HTTP_RD_RAW, or if there is nothing left),
	// or submit another physio.
	http_rd_start(conn);
	nni_mtx_unlock(&conn->mtx);
}